

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O1

void __thiscall
HandleInfoBase<XrTriangleMeshFB_T_*,_GenValidUsageXrHandleInfo>::insert
          (HandleInfoBase<XrTriangleMeshFB_T_*,_GenValidUsageXrHandleInfo> *this,
          XrTriangleMeshFB_T *handle,
          unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
          *info)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  GenValidUsageXrHandleInfo *pGVar3;
  GenValidUsageXrHandleInfo *pGVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  UniqueLock lock;
  XrTriangleMeshFB_T *local_50;
  string local_48;
  unique_lock<std::mutex> local_28;
  
  local_50 = handle;
  if (handle == (XrTriangleMeshFB_T *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Null handle passed to HandleInfoBase::insert()","");
    reportInternalError(&local_48);
  }
  local_28._M_device = &this->dispatch_mutex_;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  uVar1 = (this->info_map_)._M_h._M_bucket_count;
  uVar6 = (ulong)local_50 % uVar1;
  p_Var7 = (this->info_map_)._M_h._M_buckets[uVar6];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var7->_M_nxt, p_Var8 = p_Var7,
     local_50 != (XrTriangleMeshFB_T *)p_Var7->_M_nxt[1]._M_nxt)) {
    while (p_Var7 = p_Var2, p_Var2 = p_Var7->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar6) ||
         (p_Var8 = p_Var7, local_50 == (XrTriangleMeshFB_T *)p_Var2[1]._M_nxt)) goto LAB_002cbc69;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_002cbc69:
  if ((p_Var8 != (__node_base_ptr)0x0) && (p_Var8->_M_nxt != (_Hash_node_base *)0x0)) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Handle passed to HandleInfoBase::insert() already inserted","");
    reportInternalError(&local_48);
  }
  pmVar5 = std::__detail::
           _Map_base<XrTriangleMeshFB_T_*,_std::pair<XrTriangleMeshFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrTriangleMeshFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrTriangleMeshFB_T_*>,_std::hash<XrTriangleMeshFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<XrTriangleMeshFB_T_*,_std::pair<XrTriangleMeshFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrTriangleMeshFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrTriangleMeshFB_T_*>,_std::hash<XrTriangleMeshFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_50);
  pGVar3 = (info->_M_t).
           super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
           .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl;
  (info->_M_t).
  super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>.
  _M_t.
  super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
  .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl =
       (GenValidUsageXrHandleInfo *)0x0;
  pGVar4 = (pmVar5->_M_t).
           super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
           .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl;
  (pmVar5->_M_t).
  super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>.
  _M_t.
  super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
  .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl = pGVar3;
  if (pGVar4 != (GenValidUsageXrHandleInfo *)0x0) {
    operator_delete(pGVar4,0x18);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

inline void HandleInfoBase<HandleType, InfoType>::insert(HandleType handle, std::unique_ptr<InfoType> &&info) {
    if (handle == XR_NULL_HANDLE) {
        reportInternalError("Null handle passed to HandleInfoBase::insert()");
    }
    UniqueLock lock(dispatch_mutex_);
    auto entry_returned = info_map_.find(handle);
    if (entry_returned != info_map_.end()) {
        reportInternalError("Handle passed to HandleInfoBase::insert() already inserted");
    }
    info_map_[handle] = std::move(info);
}